

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

Graph * __thiscall
spoa::Graph::Subgraph
          (Graph *__return_storage_ptr__,Graph *this,uint32_t begin,uint32_t end,
          vector<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>
          *subgraph_to_graph)

{
  pointer puVar1;
  Node *pNVar2;
  pointer ppEVar3;
  Node *head;
  pointer ppNVar4;
  invalid_argument *this_00;
  Edge **kt;
  pointer ppEVar5;
  unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_> *it_1;
  pointer puVar6;
  unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_> *it;
  Node **kt_1;
  pointer ppNVar7;
  reference rVar8;
  allocator_type local_79;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> graph_to_subgraph;
  value_type local_60;
  vector<bool,_std::allocator<bool>_> is_in_subgraph;
  
  if (subgraph_to_graph !=
      (vector<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_> *)0x0) {
    puVar6 = (this->nodes_).
             super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ExtractSubgraph(&is_in_subgraph,this,
                    (Node *)puVar6[end]._M_t.
                            super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                            ._M_t,
                    (Node *)puVar6[begin]._M_t.
                            super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                            ._M_t);
    Graph(__return_storage_ptr__);
    __return_storage_ptr__->num_codes_ = this->num_codes_;
    std::vector<int,_std::allocator<int>_>::operator=(&__return_storage_ptr__->coder_,&this->coder_)
    ;
    std::vector<int,_std::allocator<int>_>::operator=
              (&__return_storage_ptr__->decoder_,&this->decoder_);
    if (*(long *)(subgraph_to_graph + 8) != *(long *)subgraph_to_graph) {
      *(long *)(subgraph_to_graph + 8) = *(long *)subgraph_to_graph;
    }
    graph_to_subgraph.super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>::resize
              (subgraph_to_graph,
               (long)(this->nodes_).
                     super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->nodes_).
                     super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)&graph_to_subgraph
              );
    local_60 = (value_type)0x0;
    std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::vector
              (&graph_to_subgraph,
               (long)(this->nodes_).
                     super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->nodes_).
                     super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,&local_60,&local_79);
    puVar1 = (this->nodes_).
             super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = (this->nodes_).
                  super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1)
    {
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&is_in_subgraph,
                         (ulong)((puVar6->_M_t).
                                 super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                                 .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl)->
                                id);
      if ((*rVar8._M_p & rVar8._M_mask) != 0) {
        AddNode(__return_storage_ptr__,
                ((puVar6->_M_t).
                 super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                 .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl)->code);
        graph_to_subgraph.
        super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start
        [((puVar6->_M_t).
          super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>._M_t.
          super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>.
          super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl)->id] =
             (__return_storage_ptr__->nodes_).
             super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>._M_t.
             super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>.
             super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
        *(Node **)(*(long *)subgraph_to_graph +
                  (ulong)((__return_storage_ptr__->nodes_).
                          super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                          super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                          .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl)->id * 8)
             = (puVar6->_M_t).
               super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>.
               _M_t.
               super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>.
               super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
      }
    }
    puVar1 = (this->nodes_).
             super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = (this->nodes_).
                  super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1)
    {
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&is_in_subgraph,
                         (ulong)((puVar6->_M_t).
                                 super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                                 .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl)->
                                id);
      if ((*rVar8._M_p & rVar8._M_mask) != 0) {
        pNVar2 = (puVar6->_M_t).
                 super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                 .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
        ppEVar3 = *(pointer *)
                   ((long)&(pNVar2->inedges).
                           super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                   + 8);
        head = graph_to_subgraph.
               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl
               .super__Vector_impl_data._M_start[pNVar2->id];
        for (ppEVar5 = *(pointer *)
                        &(pNVar2->inedges).
                         super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                         ._M_impl; ppEVar5 != ppEVar3; ppEVar5 = ppEVar5 + 1) {
          if (graph_to_subgraph.
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start[(*ppEVar5)->tail->id] != (Node *)0x0) {
            AddEdge(__return_storage_ptr__,
                    graph_to_subgraph.
                    super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[(*ppEVar5)->tail->id],head,
                    (uint32_t)(*ppEVar5)->weight);
          }
        }
        pNVar2 = (puVar6->_M_t).
                 super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                 .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
        ppNVar4 = *(pointer *)
                   ((long)&(pNVar2->aligned_nodes).
                           super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                   + 8);
        for (ppNVar7 = *(pointer *)
                        &(pNVar2->aligned_nodes).
                         super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                         ._M_impl; ppNVar7 != ppNVar4; ppNVar7 = ppNVar7 + 1) {
          if (graph_to_subgraph.
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start[(*ppNVar7)->id] != (Node *)0x0) {
            std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
            emplace_back<spoa::Graph::Node*&>
                      ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                       &head->aligned_nodes,
                       graph_to_subgraph.
                       super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_start + (*ppNVar7)->id);
          }
        }
      }
    }
    TopologicalSort(__return_storage_ptr__);
    std::_Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::~_Vector_base
              (&graph_to_subgraph.
                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&is_in_subgraph.super__Bvector_base<std::allocator<bool>_>);
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"[spoa::Graph::Subgraph] error: invalid ptr to subgraph_to_graph");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Graph Graph::Subgraph(
    std::uint32_t begin,
    std::uint32_t end,
    std::vector<const Node*>* subgraph_to_graph) const {
  if (!subgraph_to_graph) {
    throw std::invalid_argument(
        "[spoa::Graph::Subgraph] error: invalid ptr to subgraph_to_graph");
  }

  auto is_in_subgraph = ExtractSubgraph(nodes_[end].get(), nodes_[begin].get());

  // init subgraph
  Graph subgraph{};
  subgraph.num_codes_ = num_codes_;
  subgraph.coder_ = coder_;
  subgraph.decoder_ = decoder_;
  // subgraph.sequences_ = TODO(rvaser) maybe add sequences

  // create a map from subgraph nodes to graph nodes and vice versa
  subgraph_to_graph->clear();
  subgraph_to_graph->resize(nodes_.size(), nullptr);

  std::vector<Node*> graph_to_subgraph(nodes_.size(), nullptr);

  for (const auto& it : nodes_) {
    if (!is_in_subgraph[it->id]) {
      continue;
    }
    subgraph.AddNode(it->code);
    graph_to_subgraph[it->id] = subgraph.nodes_.back().get();
    (*subgraph_to_graph)[subgraph.nodes_.back()->id] = it.get();
  }

  // connect nodes
  for (const auto& it : nodes_) {
    if (!is_in_subgraph[it->id]) {
      continue;
    }
    auto jt = graph_to_subgraph[it->id];
    for (const auto& kt : it->inedges) {
      if (graph_to_subgraph[kt->tail->id]) {
        subgraph.AddEdge(graph_to_subgraph[kt->tail->id], jt, kt->weight);
      }
    }
    for (const auto& kt : it->aligned_nodes) {
      if (graph_to_subgraph[kt->id]) {
        jt->aligned_nodes.emplace_back(graph_to_subgraph[kt->id]);
      }
    }
  }

  subgraph.TopologicalSort();

  return subgraph;
}